

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void read_tri_vlist(char *filename,vertex_list_t *vlist)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  runtime_error *this;
  ulong uVar4;
  uint num_v;
  uint num_t;
  fstream tri_file;
  stringstream ss;
  uint local_3e8;
  string local_3e0 [32];
  double local_3c0 [66];
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::fstream::fstream(local_3c0,filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    piVar2 = std::istream::_M_extract<unsigned_int>((uint *)local_3c0);
    std::istream::_M_extract<unsigned_int>((uint *)piVar2);
    std::
    vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
    ::resize(vlist,(ulong)local_3e8);
    if (local_3e8 != 0) {
      uVar4 = 0;
      do {
        piVar2 = std::istream::_M_extract<double>(local_3c0);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        std::istream::_M_extract<double>((double *)piVar2);
        uVar4 = uVar4 + 1;
      } while (uVar4 < local_3e8);
    }
    std::fstream::close();
    std::fstream::~fstream(local_3c0);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"Failed to ensure condition ",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"tri_file.is_open()",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"at (",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/main.cpp"
             ,0x5c);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,",",1);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"read_tri_vlist",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,",",1);
  poVar3 = (ostream *)std::ostream::operator<<(local_1a0,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,") \n ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Message : ",10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\"unable to open tri file\"",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_3e0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void read_tri_vlist( const char *filename,tri_cc_geom_t::vertex_list_t &vlist)
{
  uint num_v,num_t;

  std::fstream tri_file ( filename, std::fstream::in );

  ENSURE(tri_file.is_open(),"unable to open tri file");

  tri_file >> num_v >> num_t;

  vlist.resize(num_v);

  for ( uint i = 0; i < num_v; ++i )
    tri_file>>vlist[i][0]
            >>vlist[i][1]
            >>vlist[i][2];


  tri_file.close();
}